

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferTest::iterate(FramebufferTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum err;
  undefined4 extraout_var;
  ObjectTraits *traits;
  undefined4 extraout_var_00;
  ScopedLogSection section;
  CallLogWrapper gl;
  Framebuffer fbo;
  ResultCollector result;
  ScopedLogSection local_e8;
  string local_e0;
  string local_c0;
  CallLogWrapper local_a0;
  ObjectWrapper local_88;
  ResultCollector local_70;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_88,(Functions *)CONCAT44(extraout_var,iVar4),traits);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_a0,(Functions *)CONCAT44(extraout_var_00,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_70,pTVar3,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_a0.m_enableLog = true;
  glu::CallLogWrapper::glBindFramebuffer(&local_a0,0x8ca9,local_88.m_object);
  err = glu::CallLogWrapper::glGetError(&local_a0);
  glu::checkError(err,"bind",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFramebufferDefaultStateQueryTests.cpp"
                  ,0x52);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Initial","");
  paVar2 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Initial","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar3,&local_e0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,&local_70,&local_a0);
  tcu::TestLog::endSection(local_e8.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Set","");
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar3,&local_e0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_70,&local_a0);
  tcu::TestLog::endSection(local_e8.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_70,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
    operator_delete(local_70.m_message._M_dataplus._M_p,
                    local_70.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_prefix._M_dataplus._M_p != &local_70.m_prefix.field_2) {
    operator_delete(local_70.m_prefix._M_dataplus._M_p,
                    local_70.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_a0);
  glu::ObjectWrapper::~ObjectWrapper(&local_88);
  return STOP;
}

Assistant:

FramebufferTest::IterateResult FramebufferTest::iterate (void)
{
	glu::Framebuffer		fbo		(m_context.getRenderContext());
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		checkInitial(result, gl);
	}

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Set", "Set");
		checkSet(result, gl);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}